

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O1

int __thiscall IlmThread::Semaphore::value(Semaphore *this)

{
  int iVar1;
  int value;
  int local_34;
  string local_30;
  
  iVar1 = sem_getvalue((sem_t *)&this->_semaphore,&local_34);
  if (iVar1 != 0) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"Cannot read semaphore value (%T).","");
    Iex::throwErrnoExc(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return local_34;
}

Assistant:

int
Semaphore::value () const
{
    int value;

    if (::sem_getvalue (&_semaphore, &value))
        IEX_NAMESPACE::throwErrnoExc ("Cannot read semaphore value (%T).");

    return value;
}